

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

int Nwk_ManLevelMax(Nwk_Man_t *pNtk)

{
  int iVar1;
  Nwk_Obj_t *p;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < pNtk->vCos->nSize; i = i + 1) {
    p = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vCos,i);
    iVar1 = Nwk_ObjIsPo(p);
    if ((iVar1 != 0) && (iVar2 <= p->Level)) {
      iVar2 = p->Level;
    }
  }
  return iVar2;
}

Assistant:

int Nwk_ManLevelMax( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    int i, LevelMax = 0;
    Nwk_ManForEachPo( pNtk, pObj, i )
        if ( LevelMax < Nwk_ObjLevel(pObj) )
            LevelMax = Nwk_ObjLevel(pObj);
    return LevelMax;
}